

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::FunctionModule::makeTempLocalReg(FunctionModule *this,string *hint)

{
  size_type *psVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  char cVar8;
  shared_ptr<mocker::ir::Reg> sVar9;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_81;
  ulong *local_80;
  uint local_78;
  undefined4 uStack_74;
  ulong local_70 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,*in_RDX,in_RDX[1] + *in_RDX);
  std::__cxx11::string::append((char *)&local_40);
  uVar2 = *(ulong *)((long)&hint[2].field_2 + 8);
  *(ulong *)((long)&hint[2].field_2 + 8) = uVar2 + 1;
  cVar8 = '\x01';
  if (9 < uVar2) {
    uVar6 = uVar2;
    cVar4 = '\x04';
    do {
      cVar8 = cVar4;
      if (uVar6 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00116ec1;
      }
      if (uVar6 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00116ec1;
      }
      if (uVar6 < 10000) goto LAB_00116ec1;
      bVar3 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar4 = cVar8 + '\x04';
    } while (bVar3);
    cVar8 = cVar8 + '\x01';
  }
LAB_00116ec1:
  local_80 = local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_80,local_78,uVar2);
  uVar2 = CONCAT44(uStack_74,local_78) + local_38;
  uVar6 = 0xf;
  if (local_40 != local_30) {
    uVar6 = local_30[0];
  }
  if (uVar6 < uVar2) {
    uVar6 = 0xf;
    if (local_80 != local_70) {
      uVar6 = local_70[0];
    }
    if (uVar2 <= uVar6) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_40);
      goto LAB_00116f45;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_80);
LAB_00116f45:
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_60.field_2._M_allocated_capacity = *psVar1;
    local_60.field_2._8_8_ = puVar5[3];
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar1;
    local_60._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_60._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  (this->identifier)._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Reg,std::allocator<mocker::ir::Reg>,std::__cxx11::string>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->identifier)._M_string_length,
             (Reg **)this,(allocator<mocker::ir::Reg> *)&local_81,&local_60);
  _Var7._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
    _Var7._M_pi = extraout_RDX_01;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
    _Var7._M_pi = extraout_RDX_02;
  }
  sVar9.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar9.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar9.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg> FunctionModule::makeTempLocalReg(const std::string &hint) {
  return std::make_shared<Reg>(hint + "_" + std::to_string(tempRegCounter++));
}